

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceLoader.cpp
# Opt level: O2

void __thiscall
slang::driver::SourceLoader::SourceLoader(SourceLoader *this,SourceManager *sourceManager)

{
  flat_hash_set<std::string_view> *this_00;
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  value_type_pointer pbVar3;
  ulong uVar4;
  int iVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  uint64_t uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  flat_hash_set<std::string_view> *__range2;
  basic_string_view<char,_std::char_traits<char>_> ext;
  iterator __begin2;
  
  this->sourceManager = sourceManager;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fileEntries).
  super__Vector_base<slang::driver::SourceLoader::FileEntry,_std::allocator<slang::driver::SourceLoader::FileEntry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::unordered::
  unordered_flat_map<std::filesystem::__cxx11::path,_unsigned_long,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::pair<const_std::filesystem::__cxx11::path,_unsigned_long>_>_>
  ::unordered_flat_map(&this->fileIndex);
  boost::unordered::
  unordered_flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>,_slang::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<slang::SourceLibrary,_std::default_delete<slang::SourceLibrary>_>_>_>_>
  ::unordered_flat_map(&this->libraries);
  std::
  _Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
  ::_Deque_base(&(this->unitEntries).
                 super__Deque_base<slang::driver::SourceLoader::UnitEntry,_std::allocator<slang::driver::SourceLoader::UnitEntry>_>
               );
  this_00 = &this->uniqueExtensions;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->searchExtensions).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->searchDirectories).
    super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->searchDirectories).
  super__Vector_base<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  boost::unordered::
  unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::unordered_flat_set(this_00);
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->libraryMapTrees).
  super__Vector_base<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->errors).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->errors).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ext._M_len = 2;
  ext._M_str = ".v";
  uVar12 = detail::hashing::hash(".v",2);
  uVar13 = uVar12 >> ((byte)(this->uniqueExtensions).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar15 = (uVar12 & 0xff) * 4;
  uVar6 = (&UNK_007e24cc)[lVar15];
  uVar7 = (&UNK_007e24cd)[lVar15];
  uVar8 = (&UNK_007e24ce)[lVar15];
  bVar9 = (&UNK_007e24cf)[lVar15];
  uVar14 = 0;
  uVar16 = uVar13;
  do {
    pgVar2 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar16;
    bVar17 = pgVar1->m[0xf].n;
    auVar18[0] = -(pgVar1->m[0].n == uVar6);
    auVar18[1] = -(pgVar1->m[1].n == uVar7);
    auVar18[2] = -(pgVar1->m[2].n == uVar8);
    auVar18[3] = -(pgVar1->m[3].n == bVar9);
    auVar18[4] = -(pgVar1->m[4].n == uVar6);
    auVar18[5] = -(pgVar1->m[5].n == uVar7);
    auVar18[6] = -(pgVar1->m[6].n == uVar8);
    auVar18[7] = -(pgVar1->m[7].n == bVar9);
    auVar18[8] = -(pgVar1->m[8].n == uVar6);
    auVar18[9] = -(pgVar1->m[9].n == uVar7);
    auVar18[10] = -(pgVar1->m[10].n == uVar8);
    auVar18[0xb] = -(pgVar1->m[0xb].n == bVar9);
    auVar18[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar18[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar18[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar18[0xf] = -(bVar17 == bVar9);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe);
    if (uVar11 != 0) {
      pbVar3 = (this->uniqueExtensions).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.elements_;
      do {
        iVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_00,&ext,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&pbVar3[uVar16 * 0xf]._M_len + (ulong)(uint)(iVar5 << 4)));
        if (bVar10) goto LAB_0053b919;
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar17 = pgVar2[uVar16].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar17) == 0) break;
    uVar4 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.groups_size_mask;
    lVar15 = uVar16 + uVar14;
    uVar14 = uVar14 + 1;
    uVar16 = lVar15 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  if ((this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.size <
      (this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&__begin2,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)this_00,uVar13,uVar12,&ext);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&__begin2,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)this_00,uVar12,&ext);
  }
LAB_0053b919:
  ext._M_len = 3;
  ext._M_str = ".sv";
  uVar12 = detail::hashing::hash(".sv",3);
  uVar13 = uVar12 >> ((byte)(this_00->table_).
                            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                            .arrays.groups_size_index & 0x3f);
  lVar15 = (uVar12 & 0xff) * 4;
  uVar6 = (&UNK_007e24cc)[lVar15];
  uVar7 = (&UNK_007e24cd)[lVar15];
  uVar8 = (&UNK_007e24ce)[lVar15];
  bVar9 = (&UNK_007e24cf)[lVar15];
  uVar14 = 0;
  uVar16 = uVar13;
  do {
    pgVar2 = (this->uniqueExtensions).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
             .arrays.groups_;
    pgVar1 = pgVar2 + uVar16;
    bVar17 = pgVar1->m[0xf].n;
    auVar19[0] = -(pgVar1->m[0].n == uVar6);
    auVar19[1] = -(pgVar1->m[1].n == uVar7);
    auVar19[2] = -(pgVar1->m[2].n == uVar8);
    auVar19[3] = -(pgVar1->m[3].n == bVar9);
    auVar19[4] = -(pgVar1->m[4].n == uVar6);
    auVar19[5] = -(pgVar1->m[5].n == uVar7);
    auVar19[6] = -(pgVar1->m[6].n == uVar8);
    auVar19[7] = -(pgVar1->m[7].n == bVar9);
    auVar19[8] = -(pgVar1->m[8].n == uVar6);
    auVar19[9] = -(pgVar1->m[9].n == uVar7);
    auVar19[10] = -(pgVar1->m[10].n == uVar8);
    auVar19[0xb] = -(pgVar1->m[0xb].n == bVar9);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar6);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar7);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar8);
    auVar19[0xf] = -(bVar17 == bVar9);
    uVar11 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
    if (uVar11 != 0) {
      pbVar3 = (this->uniqueExtensions).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.elements_;
      do {
        iVar5 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
          }
        }
        bVar10 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                           ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            this_00,&ext,
                            (basic_string_view<char,_std::char_traits<char>_> *)
                            ((long)&pbVar3[uVar16 * 0xf]._M_len + (ulong)(uint)(iVar5 << 4)));
        if (bVar10) goto LAB_0053ba8f;
        uVar11 = uVar11 - 1 & uVar11;
      } while (uVar11 != 0);
      bVar17 = pgVar2[uVar16].m[0xf].n;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar17) == 0) break;
    uVar4 = (this->uniqueExtensions).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
            .arrays.groups_size_mask;
    lVar15 = uVar16 + uVar14;
    uVar14 = uVar14 + 1;
    uVar16 = lVar15 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  if ((this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.size <
      (this->uniqueExtensions).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&__begin2,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)this_00,uVar13,uVar12,&ext);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
    ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)&__begin2,
               (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                *)this_00,uVar12,&ext);
  }
LAB_0053ba8f:
  __begin2 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin(&this_00->table_);
  while (__begin2.p_ != (table_element_pointer)0x0) {
    ext._M_len = (__begin2.p_)->_M_len;
    ext._M_str = (__begin2.p_)->_M_str;
    std::vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::filesystem::__cxx11::path,std::allocator<std::filesystem::__cxx11::path>>
                *)&this->searchExtensions,&ext);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,_std::char_traits<char>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::increment(&__begin2);
  }
  return;
}

Assistant:

SourceLoader::SourceLoader(SourceManager& sourceManager) : sourceManager(sourceManager) {
    // When searching for library modules we will always include these extensions
    // in addition to anything the user provides.
    uniqueExtensions.emplace(".v"sv);
    uniqueExtensions.emplace(".sv"sv);
    for (auto ext : uniqueExtensions)
        searchExtensions.emplace_back(ext);
}